

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.cc
# Opt level: O2

Metadata google::protobuf::Message::GetMetadataImpl(ClassDataFull *data)

{
  __int_type_conflict1 _Var1;
  DescriptorTable *table;
  once_flag *w;
  uint32_t uVar2;
  bool bVar3;
  Metadata MVar4;
  
  table = data->descriptor_table;
  if (table != (DescriptorTable *)0x0) {
    if (data->get_metadata_tracker != (_func_void *)0x0) {
      (*data->get_metadata_tracker)();
    }
    w = table->once;
    if ((w->control_).super___atomic_base<unsigned_int>._M_i != 0xdd) {
      _Var1 = (w->control_).super___atomic_base<unsigned_int>._M_i;
      if ((((_Var1 != 0) && (_Var1 != 0xdd)) && (_Var1 != 0x5a308d2)) && (_Var1 != 0x65c2937b)) {
        absl::lts_20250127::raw_log_internal::RawLog
                  (kFatal,"call_once.h",0xa4,"Unexpected value for control word: 0x%lx");
        __assert_fail("false && \"ABSL_UNREACHABLE reached\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O2/_deps/absl-src/absl/base/call_once.h"
                      ,0xa4,
                      "void absl::base_internal::CallOnceImpl(absl::Nonnull<std::atomic<uint32_t> *>, base_internal::SchedulingMode, Callable &&, Args &&...) [Callable = (lambda at /workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/message.cc:167:35), Args = <>]"
                     );
      }
      LOCK();
      bVar3 = (w->control_).super___atomic_base<unsigned_int>._M_i == 0;
      if (bVar3) {
        (w->control_).super___atomic_base<unsigned_int>._M_i = 0x65c2937b;
      }
      UNLOCK();
      if ((bVar3) ||
         (uVar2 = absl::lts_20250127::base_internal::SpinLockWait
                            (&w->control_,3,
                             (SpinLockWaitTransition *)
                             absl::lts_20250127::base_internal::
                             CallOnceImpl<google::protobuf::Message::GetMetadataImpl(google::protobuf::internal::ClassDataFull_const&)::$_0>(std::atomic<unsigned_int>*,absl::lts_20250127::base_internal::SchedulingMode,google::protobuf::Message::GetMetadataImpl(google::protobuf::internal::ClassDataFull_const&)::$_0&&)
                             ::trans,SCHEDULE_COOPERATIVE_AND_KERNEL), uVar2 == 0)) {
        internal::AssignDescriptorsOnceInnerCall(table);
        LOCK();
        _Var1 = (w->control_).super___atomic_base<unsigned_int>._M_i;
        (w->control_).super___atomic_base<unsigned_int>._M_i = 0xdd;
        UNLOCK();
        if (_Var1 == 0x5a308d2) {
          AbslInternalSpinLockWake_lts_20250127(&w->control_,true);
        }
      }
    }
  }
  MVar4.reflection = data->reflection;
  MVar4.descriptor = data->descriptor;
  return MVar4;
}

Assistant:

Metadata Message::GetMetadataImpl(const internal::ClassDataFull& data) {
  auto* table = data.descriptor_table;
  // Only codegen types provide a table. DynamicMessage does not provide a table
  // and instead eagerly initializes the descriptor/reflection members.
  if (ABSL_PREDICT_TRUE(table != nullptr)) {
    if (ABSL_PREDICT_FALSE(data.get_metadata_tracker != nullptr)) {
      data.get_metadata_tracker();
    }
    absl::call_once(*table->once, [table] {
      internal::AssignDescriptorsOnceInnerCall(table);
    });
  }
  return {data.descriptor, data.reflection};
}